

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompileTest.cpp
# Opt level: O2

void CompiledMixedType<int,long>(void)

{
  SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> SVar1;
  uint uVar2;
  long in_stack_ffffffffffffffa8;
  long local_50;
  SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> st2;
  SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> local_44;
  SafeInt<long,_safeint_exception_handlers::SafeInt_InvalidParameter> su;
  long u;
  
  u = 0;
  SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<long>(&local_44,&u);
  su.m_int = u;
  SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<long>(&st2,&su);
  local_44.m_int = 0;
  SafeInt<int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<int,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_44,&u);
  SafeCastHelper<int,_long,_4>::CastThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
            (su.m_int,(int *)&local_44);
  local_44.m_int = st2.m_int;
  SafeInt<int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator*
            ((SafeInt<int,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_44,u);
  SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator*(&local_44,st2);
  operator*(u,local_44);
  SafeInt<int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator*=
            ((SafeInt<int,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_44,u);
  SafeInt<int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator*=
            ((SafeInt<int,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_44,su);
  u = 1;
  uVar2 = 1;
  su.m_int = 1;
  local_44.m_int = uVar2;
  SafeInt<int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator%
            ((SafeInt<int,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_44,1);
  st2.m_int = uVar2;
  SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator%
            (&local_44,(SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter>)0x1);
  SafeInt<int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator%=
            ((SafeInt<int,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_44,u);
  SafeInt<int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator%=
            ((SafeInt<int,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_44,su);
  u = 1;
  st2.m_int = uVar2;
  local_44.m_int = uVar2;
  SafeInt<int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator/
            ((SafeInt<int,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_44,1);
  SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator/(&local_44,st2);
  operator/(u,local_44);
  SafeInt<int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator/=
            ((SafeInt<int,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_44,u);
  SafeInt<int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator/=
            ((SafeInt<int,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_44,su);
  SafeInt<int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator+
            ((SafeInt<int,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_44,u);
  SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator+(&local_44,st2);
  operator+(u,local_44);
  SafeInt<int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator+=
            ((SafeInt<int,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_44,u);
  SafeInt<int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator+=
            ((SafeInt<int,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_44,su);
  local_44.m_int = 0;
  u = 0;
  st2.m_int = 0;
  SafeInt<int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator-
            ((SafeInt<int,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_44,0);
  SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator-(&local_44,st2);
  operator-(in_stack_ffffffffffffffa8,
            (SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter>)0x0);
  SafeInt<int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator-=
            ((SafeInt<int,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_44,u);
  su.m_int = 1;
  local_44.m_int = uVar2;
  SafeInt<int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator-=
            ((SafeInt<int,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_44,
             (SafeInt<long,_safeint_exception_handlers::SafeInt_InvalidParameter>)0x1);
  u = 1;
  su.m_int = 1;
  SafeInt<int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator<<
            ((SafeInt<int,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_44,1);
  SVar1 = SafeInt<int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator<<
                    ((SafeInt<int,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_44,
                     su);
  operator<<(SVar1.m_int,su);
  SafeInt<int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator<<=
            ((SafeInt<int,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_44,u);
  SafeInt<int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator<<=
            ((SafeInt<int,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_44,su);
  SafeInt<int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator>>
            ((SafeInt<int,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_44,u);
  SVar1 = SafeInt<int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator>>
                    ((SafeInt<int,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_44,
                     su);
  operator>>(SVar1.m_int,su);
  SafeInt<int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator>>=
            ((SafeInt<int,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_44,u);
  SafeInt<int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator>>=
            ((SafeInt<int,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_44,su);
  local_50 = BinaryAndHelper<long,_int,_3>::And(su.m_int,local_44.m_int & (uint)u);
  SafeInt::operator_cast_to_int((SafeInt *)&local_50);
  local_44.m_int = (uint)su.m_int & (uint)u & local_44.m_int & st2.m_int;
  local_50 = BinaryOrHelper<long,_int,_3>::Or(su.m_int,(uint)u);
  SafeInt::operator_cast_to_int((SafeInt *)&local_50);
  local_44.m_int = (uint)su.m_int | (uint)u | local_44.m_int | st2.m_int;
  local_50 = BinaryXorHelper<long,_int,_3>::Xor(su.m_int,local_44.m_int ^ (uint)u);
  SafeInt::operator_cast_to_int((SafeInt *)&local_50);
  return;
}

Assistant:

void CompiledMixedType()
{
	// Mixed constructors
	U u = 0;
	T t = 0;
	bool b = false;
	SafeInt<T> st(u);
	SafeInt<U> su(u);
	SafeInt<T> st2(su);

	// Shut up the compiler
	b = !b;

	// Assignment
	st = t;
	st = u;
	st = su;
	st = st2;

	// Casting
	U u2 = (U)st;

	// Multiplication
	t = st * u;
	t = st * st2;
	t = u * st;
	st *= u;
	st *= su;

	// Modulus, modulus assignment
	u = 1;
	st = 1;
	su = 1;
	// For some reason, this is annoying the VS17 link time code generation
//	t = u % st;

	t = st % u;
	st2 = 1;
	t = st % st2;
	st %= u;
	st %= su;

	// Division
	u = 1;
	st2 = 1;
	st = 1;
	t = st / u;
	t = st / st2;
	t = u / st;
	st /= u;
	st /= su;

	// Addition
	t = st + u;
	t = st + st2;
	t = u + st;
	st += u;
	st += su;

	// Subtraction
	st = 0;
	u = 0;
	st2 = 0;
	t = st - u;
	t = st - st2;
	t = u - st;
	st -= u;

	st = 1;
	su = 1;
	st -= su;

	// Shift operators
	u = 1;
	su = 1;
	// Left
	t = st << u;
	t = st << su;
	t = t << su;

	st <<= u;
	st <<= su;

	// Right
	t = st >> u;
	t = st >> su;
	t = t >> su;

	st >>= u;
	st >>= su;

	// Binary operations
	// And
	t = st & st2;
	t = st & u;
	t = t & su;

	st &= st2;
	st &= u;
	st &= su;

	// Or
	t = st | st2;
	t = st | u;
	t = t | su;

	st |= st2;
	st |= u;
	st |= su;

	// Xor
	t = st ^ st2;
	t = st ^ u;
	t = t ^ su;

	st ^= st2;
	st ^= u;
	st ^= su;

	// Comparisons
	// Less than
	b = st < su;
	b = st < u;
	b = u < st;
	b = st < su;

	// Less than or equal
	b = st <= su;
	b = st <= u;
	b = u <= st;
	b = st <= su;

	// Greater than
	b = st > su;
	b = st > u;
	b = u > st;
	b = st > su;

	// Greater than or equal
	b = st >= su;
	b = st >= u;
	b = u >= st;
	b = st >= su;

	// Equals
	b = st == su;
	b = st == u;
	b = u == st;
	b = st == su;
}